

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection2.c
# Opt level: O0

void ssh2_connection_process_queue(PacketProtocolLayer *ppl)

{
  int iVar1;
  uint uVar2;
  Ssh *ssh;
  PktIn *pPVar3;
  _Bool _Var4;
  prompts_t *ppVar5;
  InteractionReadySeat iseat;
  mainchan *pmVar6;
  char *pcVar7;
  SeatPromptResult local_70;
  Seat *local_50;
  SeatPromptResult local_48;
  PktIn *local_28;
  int *crLine;
  PktIn *pktin;
  ssh2_connection_state *s;
  PacketProtocolLayer *ppl_local;
  
  pktin = (PktIn *)&ppl[-3].interactor;
  s = (ssh2_connection_state *)ppl;
  _Var4 = ssh2_connection_filter_queue((ssh2_connection_state *)pktin);
  pPVar3 = pktin;
  if (_Var4) {
    return;
  }
  local_28 = pktin;
  iVar1 = pktin->type;
  if (iVar1 == 0) {
    if (pktin->sequence != 0) {
      share_activate((ssh_sharing_state *)pktin->sequence,(char *)(pktin->qnode).next);
    }
    _Var4 = ssh2_connection_need_antispoof_prompt((ssh2_connection_state *)pktin);
    if (_Var4) {
      ppVar5 = ssh_ppl_new_prompts((PacketProtocolLayer *)&pktin[2].binarysource_[0].pos);
      pktin[1].binarysource_[0].pos = (size_t)ppVar5;
      *(undefined1 *)pktin[1].binarysource_[0].pos = 1;
      *(undefined1 *)(pktin[1].binarysource_[0].pos + 1) = 0;
      pcVar7 = dupstr("Authentication successful");
      *(char **)(pktin[1].binarysource_[0].pos + 8) = pcVar7;
      ppVar5 = (prompts_t *)pktin[1].binarysource_[0].pos;
      pcVar7 = dupstr("Access granted. Press Return to begin session. ");
      add_prompt(ppVar5,pcVar7,false);
      pPVar3 = pktin;
      local_50 = (Seat *)ppl_get_iseat((PacketProtocolLayer *)&pktin[2].binarysource_[0].pos);
      seat_get_userpass_input
                (&local_48,(InteractionReadySeat)local_50,(prompts_t *)pktin[1].binarysource_[0].pos
                );
      pPVar3[1].binarysource_[0].len = local_48._0_8_;
      *(_func_void_SeatPromptResult_BinarySink_ptr **)&pPVar3[1].binarysource_[0].err =
           local_48.errfn;
      pPVar3[1].binarysource_[0].binarysource_ = (BinarySource *)local_48.errdata_lit;
      pPVar3[2].type = local_48.errdata_u;
      *(undefined4 *)&pPVar3[2].field_0x4 = local_48._28_4_;
      goto LAB_0012f1eb;
    }
  }
  else {
    if (iVar1 != 0x3e9) {
      if (iVar1 != 0x413) {
        pktin->type = 0;
        return;
      }
      goto LAB_0012f321;
    }
    iseat = ppl_get_iseat((PacketProtocolLayer *)&pktin[2].binarysource_[0].pos);
    seat_get_userpass_input(&local_70,iseat,(prompts_t *)pktin[1].binarysource_[0].pos);
    pPVar3[1].binarysource_[0].len = local_70._0_8_;
    *(_func_void_SeatPromptResult_BinarySink_ptr **)&pPVar3[1].binarysource_[0].err = local_70.errfn
    ;
    pPVar3[1].binarysource_[0].binarysource_ = (BinarySource *)local_70.errdata_lit;
    pPVar3[2].type = local_70.errdata_u;
    *(undefined4 *)&pPVar3[2].field_0x4 = local_70._28_4_;
LAB_0012f1eb:
    if ((int)pktin[1].binarysource_[0].len == 0) {
      local_28->type = 0x3e9;
      return;
    }
    free_prompts((prompts_t *)pktin[1].binarysource_[0].pos);
    pktin[1].binarysource_[0].pos = 0;
  }
  portfwdmgr_config(*(PortFwdManager **)&pktin[1].qnode.on_free_queue,
                    (Conf *)pktin->binarysource_[0].binarysource_);
  *(undefined1 *)&pktin[1].binarysource_[0].data = 1;
  pmVar6 = mainchan_new((PacketProtocolLayer *)&pktin[2].binarysource_[0].pos,
                        (ConnectionLayer *)&pktin[2].qnode.on_free_queue,
                        (Conf *)pktin->binarysource_[0].binarysource_,
                        *(int *)((long)&pktin->binarysource_[0].data + 4),
                        (int)pktin->binarysource_[0].pos,
                        (_Bool)((char)pktin->binarysource_[0].err & BSE_OUT_OF_DATA),
                        (SshChannel **)&(pktin->qnode).formal_size);
  (pktin->qnode).prev = (PacketQueueNode *)pmVar6;
  *(byte *)((long)&pktin->binarysource_[0].err + 2) = 1;
LAB_0012f321:
  crLine = &ssh2_connection_pop((ssh2_connection_state *)pktin)->type;
  if ((PktIn *)crLine == (PktIn *)0x0) {
    local_28->type = 0x413;
  }
  else {
    ssh = (Ssh *)pktin[3].binarysource_[0].pos;
    uVar2 = ((PktIn *)crLine)->type;
    pcVar7 = ssh2_pkt_type(*(Pkt_KCtx *)(*(long *)(pktin[2].binarysource_[0].len + 0x90) + 4),
                           *(Pkt_ACtx *)(*(long *)(pktin[2].binarysource_[0].len + 0x90) + 8),
                           ((PktIn *)crLine)->type);
    ssh_proto_error(ssh,"Received unexpected connection-layer packet, type %d (%s)",(ulong)uVar2,
                    pcVar7);
  }
  return;
}

Assistant:

static void ssh2_connection_process_queue(PacketProtocolLayer *ppl)
{
    struct ssh2_connection_state *s =
        container_of(ppl, struct ssh2_connection_state, ppl);
    PktIn *pktin;

    if (ssh2_connection_filter_queue(s)) /* no matter why we were called */
        return;

    crBegin(s->crState);

    if (s->connshare)
        share_activate(s->connshare, s->peer_verstring);

    /*
     * Signal the seat that authentication is done, so that it can
     * deploy spoofing defences. If it doesn't have any, deploy our
     * own fallback one.
     *
     * We do this here rather than at the end of userauth, because we
     * might not have gone through userauth at all (if we're a
     * connection-sharing downstream).
     */
    if (ssh2_connection_need_antispoof_prompt(s)) {
        s->antispoof_prompt = ssh_ppl_new_prompts(&s->ppl);
        s->antispoof_prompt->to_server = true;
        s->antispoof_prompt->from_server = false;
        s->antispoof_prompt->name = dupstr("Authentication successful");
        add_prompt(
            s->antispoof_prompt,
            dupstr("Access granted. Press Return to begin session. "), false);
        s->antispoof_ret = seat_get_userpass_input(
            ppl_get_iseat(&s->ppl), s->antispoof_prompt);
        while (s->antispoof_ret.kind == SPRK_INCOMPLETE) {
            crReturnV;
            s->antispoof_ret = seat_get_userpass_input(
                ppl_get_iseat(&s->ppl), s->antispoof_prompt);
        }
        free_prompts(s->antispoof_prompt);
        s->antispoof_prompt = NULL;
    }

    /*
     * Enable port forwardings.
     */
    portfwdmgr_config(s->portfwdmgr, s->conf);
    s->portfwdmgr_configured = true;

    /*
     * Create the main session channel, if any.
     */
    s->mainchan = mainchan_new(
        &s->ppl, &s->cl, s->conf, s->term_width, s->term_height,
        s->ssh_is_simple, &s->mainchan_sc);
    s->started = true;

    /*
     * Transfer data!
     */

    while (1) {
        if ((pktin = ssh2_connection_pop(s)) != NULL) {

            /*
             * _All_ the connection-layer packets we expect to
             * receive are now handled by the dispatch table.
             * Anything that reaches here must be bogus.
             */

            ssh_proto_error(s->ppl.ssh, "Received unexpected connection-layer "
                            "packet, type %d (%s)", pktin->type,
                            ssh2_pkt_type(s->ppl.bpp->pls->kctx,
                                          s->ppl.bpp->pls->actx,
                                          pktin->type));
            return;
        }
        crReturnV;
    }

    crFinishV;
}